

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode tool_setopt(CURL *curl,_Bool str,GlobalConfig *global,OperationConfig *config,char *name,
                    CURLoption tag,...)

{
  char in_AL;
  char *pcVar1;
  char *pcVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *in_stack_00000008;
  undefined1 local_138 [48];
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  char *local_80;
  char *escaped;
  curl_off_t len;
  char *remark;
  void *pval;
  undefined4 local_58;
  CURLcode ret;
  va_list arg;
  CURLoption tag_local;
  char *name_local;
  OperationConfig *config_local;
  GlobalConfig *global_local;
  _Bool str_local;
  CURL *curl_local;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  arg[0].overflow_arg_area = local_138;
  arg[0]._0_8_ = &stack0x00000010;
  ret = CURLE_UNKNOWN_OPTION;
  local_58 = 0x30;
  pval._4_4_ = 0;
  remark = in_stack_00000008;
  pval._4_4_ = curl_easy_setopt(curl,tag,in_stack_00000008);
  if (((global->libcurl != (char *)0x0) && (remark != (char *)0x0)) && (pval._4_4_ == CURLE_OK)) {
    if (str) {
      escaped = (char *)0xffffffffffffffff;
      if (tag == CURLOPT_POSTFIELDS) {
        escaped = (char *)curlx_dyn_len(&config->postdata);
      }
      local_80 = c_escape(remark,(curl_off_t)escaped);
      if (local_80 != (char *)0x0) {
        pval._4_4_ = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, \"%s\");",name,local_80);
        free(local_80);
      }
    }
    else {
      pcVar1 = "object";
      if (19999 < tag) {
        pcVar1 = "function";
      }
      pcVar2 = "";
      if (*pcVar1 == 'o') {
        pcVar2 = "n";
      }
      len = (curl_off_t)pcVar1;
      pval._4_4_ = easysrc_addf(&easysrc_toohard,"%s was set to a%s %s pointer",name,pcVar2,pcVar1);
    }
  }
  return pval._4_4_;
}

Assistant:

CURLcode tool_setopt(CURL *curl, bool str, struct GlobalConfig *global,
                     struct OperationConfig *config,
                     const char *name, CURLoption tag, ...)
{
  va_list arg;
  CURLcode ret = CURLE_OK;
  void *pval;

  va_start(arg, tag);

  DEBUGASSERT(tag >= CURLOPTTYPE_OBJECTPOINT);
  DEBUGASSERT((tag < CURLOPTTYPE_OFF_T) || (tag >= CURLOPTTYPE_BLOB));

  /* we never set _BLOB options in the curl tool */
  DEBUGASSERT(tag < CURLOPTTYPE_BLOB);

  /* argument is an object or function pointer */
  pval = va_arg(arg, void *);

  ret = curl_easy_setopt(curl, tag, pval);

  va_end(arg);

  if(global->libcurl && pval && !ret) {
    /* we only use this if --libcurl was used */

    if(!str) {
      /* function pointers are never printable */
      const char *remark = (tag >= CURLOPTTYPE_FUNCTIONPOINT) ?
        "function" : "object";
      ret = easysrc_addf(&easysrc_toohard,
                         "%s was set to a%s %s pointer", name,
                         (*remark == 'o' ? "n" : ""), remark);
    }
    else {
      curl_off_t len = ZERO_TERMINATED;
      char *escaped;
      if(tag == CURLOPT_POSTFIELDS)
        len = curlx_dyn_len(&config->postdata);
      escaped = c_escape(pval, len);
      if(escaped) {
        ret = easysrc_addf(&easysrc_code, "curl_easy_setopt(hnd, %s, \"%s\");",
                           name, escaped);
        free(escaped);
      }
    }
  }

  return ret;
}